

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  bool bVar1;
  ImFontAtlas *this;
  undefined4 in_ECX;
  int in_ESI;
  ImFontAtlasCustomRect *in_RDI;
  int in_R8D;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  ImTextureID tex_id;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas *font_atlas;
  undefined4 in_stack_fffffffffffffe38;
  int iVar18;
  undefined4 in_stack_fffffffffffffe3c;
  ImDrawList *in_stack_fffffffffffffe40;
  ImVec2 *this_00;
  ImVec2 *p_max;
  ImVec2 *in_stack_fffffffffffffe70;
  ImVec2 *this_01;
  float _y;
  undefined4 in_stack_fffffffffffffe7c;
  float _x;
  ImDrawList *in_stack_fffffffffffffe80;
  ImDrawList *this_02;
  ImU32 IVar19;
  undefined8 in_stack_fffffffffffffe90;
  ImVec2 *pIVar20;
  ImVec2 *in_stack_fffffffffffffec0;
  ImVec2 *in_stack_fffffffffffffec8;
  ImVec2 *in_stack_fffffffffffffed0;
  ImFontAtlas *this_03;
  ImFontAtlas *pIVar21;
  undefined1 local_e8 [40];
  ImDrawVert *local_c0;
  undefined8 local_b8;
  ImDrawListSharedData *local_b0;
  ImVec2 local_a8 [2];
  ImDrawVert *local_98;
  ImDrawIdx *local_90;
  ImVec2 local_88;
  ImVec4 *local_80;
  ImVector<void_*> local_78;
  undefined1 local_68 [40];
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  int local_24;
  undefined4 local_20;
  ImFontAtlasCustomRect *local_10;
  ImVec2 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  local_8 = (ImVec2)vmovlpd_avx(in_ZMM0._0_16_);
  if (in_ESI != -1) {
    local_30 = *(ImVec2 *)(*(long *)((long)*(ImVec2 *)((long)(in_RDI + 1) + 0x18) + 8) + 0x48);
    local_24 = in_R8D;
    local_20 = in_ECX;
    local_10 = in_RDI;
    ImVec2::ImVec2(&local_38);
    ImVec2::ImVec2(&local_40);
    pIVar21 = (ImFontAtlas *)((ImVec2 *)local_68 + 4);
    this = (ImFontAtlas *)local_68;
    do {
      this_03 = this;
      ImVec2::ImVec2((ImVec2 *)this_03);
      IVar19 = (ImU32)in_stack_fffffffffffffe90;
      this = (ImFontAtlas *)&this_03->TexID;
    } while (this != pIVar21);
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,(ImGuiMouseCursor)((ulong)pIVar21 >> 0x20),(ImVec2 *)this_03,
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                      );
    if (bVar1) {
      ::operator-=(&local_8,&local_38);
      local_78.Data = *(void ***)((long)local_30 + 8);
      ImDrawList::PushTextureID
                (in_stack_fffffffffffffe40,
                 (ImTextureID)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      _y = 0.0;
      p_max = (ImVec2 *)local_78.Data;
      ImVec2::ImVec2(&local_88,1.0,0.0);
      auVar2._0_8_ = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),0.0);
      auVar2._8_56_ = extraout_var;
      local_80 = (ImVec4 *)vmovlpd_avx(auVar2._0_16_);
      auVar3._0_8_ = ::operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                 (ImVec2 *)0x459194);
      auVar3._8_56_ = extraout_var_00;
      local_78._0_8_ = vmovlpd_avx(auVar3._0_16_);
      this_00 = local_a8;
      ImVec2::ImVec2(this_00,1.0,_y);
      auVar4._0_8_ = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),0.0);
      auVar4._8_56_ = extraout_var_01;
      local_a8[1] = (ImVec2)vmovlpd_avx(auVar4._0_16_);
      auVar5._0_8_ = ::operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                 (ImVec2 *)0x4591f0);
      auVar5._8_56_ = extraout_var_02;
      local_98 = (ImDrawVert *)vmovlpd_avx(auVar5._0_16_);
      auVar6._0_8_ = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),0.0);
      auVar6._8_56_ = extraout_var_03;
      local_b0 = (ImDrawListSharedData *)vmovlpd_avx(auVar6._0_16_);
      auVar7._0_8_ = ::operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                 (ImVec2 *)0x459235);
      auVar7._8_56_ = extraout_var_04;
      local_90 = (ImDrawIdx *)vmovlpd_avx(auVar7._0_16_);
      iVar18 = local_24;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe80,(ImTextureID)CONCAT44(in_stack_fffffffffffffe7c,_y),
                 in_stack_fffffffffffffe70,p_max,(ImVec2 *)local_10,this_00,IVar19);
      this_01 = (ImVec2 *)(local_e8 + 0x20);
      _x = 2.0;
      pIVar20 = (ImVec2 *)local_78.Data;
      ImVec2::ImVec2(this_01,2.0,_y);
      IVar19 = (ImU32)pIVar20;
      auVar8._0_8_ = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar18),0.0);
      auVar8._8_56_ = extraout_var_05;
      local_c0 = (ImDrawVert *)vmovlpd_avx(auVar8._0_16_);
      auVar9._0_8_ = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar18),
                                 (ImVec2 *)0x4592f4);
      auVar9._8_56_ = extraout_var_06;
      local_b8 = vmovlpd_avx(auVar9._0_16_);
      this_02 = (ImDrawList *)local_e8;
      ImVec2::ImVec2((ImVec2 *)this_02,_x,_y);
      auVar10._0_8_ = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar18),0.0);
      auVar10._8_56_ = extraout_var_07;
      local_e8._8_8_ = vmovlpd_avx(auVar10._0_16_);
      auVar11._0_8_ =
           ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar18),(ImVec2 *)0x459350);
      auVar11._8_56_ = extraout_var_08;
      local_e8._16_8_ = vmovlpd_avx(auVar11._0_16_);
      auVar12._0_8_ = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar18),0.0);
      auVar12._8_56_ = extraout_var_09;
      vmovlpd_avx(auVar12._0_16_);
      auVar13._0_8_ =
           ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar18),(ImVec2 *)0x45938d);
      auVar13._8_56_ = extraout_var_10;
      local_e8._24_8_ = vmovlpd_avx(auVar13._0_16_);
      ImDrawList::AddImage
                (this_02,(ImTextureID)CONCAT44(_x,_y),this_01,p_max,(ImVec2 *)local_10,this_00,
                 IVar19);
      auVar14._0_8_ = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_24),0.0);
      auVar14._8_56_ = extraout_var_11;
      vmovlpd_avx(auVar14._0_16_);
      auVar15._0_8_ =
           ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_24),(ImVec2 *)0x459419);
      auVar15._8_56_ = extraout_var_12;
      vmovlpd_avx(auVar15._0_16_);
      ImDrawList::AddImage
                (this_02,(ImTextureID)CONCAT44(_x,_y),this_01,p_max,(ImVec2 *)local_10,this_00,
                 IVar19);
      auVar16._0_8_ = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_20),0.0);
      auVar16._8_56_ = extraout_var_13;
      vmovlpd_avx(auVar16._0_16_);
      auVar17._0_8_ =
           ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_20),(ImVec2 *)0x4594ab);
      auVar17._8_56_ = extraout_var_14;
      vmovlpd_avx(auVar17._0_16_);
      ImDrawList::AddImage
                (this_02,(ImTextureID)CONCAT44(_x,_y),this_01,p_max,(ImVec2 *)local_10,this_00,
                 IVar19);
      ImDrawList::PopTextureID(in_stack_fffffffffffffe40);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}